

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::ZConsVisitor::update(ZConsVisitor *this)

{
  bool bVar1;
  pointer ppVar2;
  RealType in_RDI;
  iterator k;
  const_iterator j;
  vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_> *fixedZmolData;
  iterator i;
  Vector3d com;
  map<int,_OpenMD::ZConsVisitor::ZConsState,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
  *in_stack_ffffffffffffff88;
  __normal_iterator<const_OpenMD::ZconsData_*,_std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>_>
  *in_stack_ffffffffffffff90;
  ZConsVisitor *in_stack_ffffffffffffffa0;
  __normal_iterator<const_OpenMD::ZconsData_*,_std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>_>
  local_48;
  vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_> *local_40;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_> local_28 [5];
  
  Vector3<double>::Vector3((Vector3<double> *)0x353ded);
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>::_Rb_tree_iterator
            (local_28);
  local_30 = (_Base_ptr)
             std::
             map<int,_OpenMD::ZConsVisitor::ZConsState,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
             ::begin(in_stack_ffffffffffffff88);
  local_28[0]._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_OpenMD::ZConsVisitor::ZConsState,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
         ::end(in_stack_ffffffffffffff88);
    bVar1 = std::operator!=(local_28,&local_38);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>::
             operator->((_Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>
                         *)0x353e46);
    ppVar2->second = zsMoving;
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_> *)
               in_stack_ffffffffffffff90);
  }
  Snapshot::getTime(*(Snapshot **)((long)in_RDI + 0xb0));
  readZconsFile(in_stack_ffffffffffffffa0,in_RDI);
  local_40 = ZConsReader::getFixedZMolData(*(ZConsReader **)((long)in_RDI + 0xa0));
  __gnu_cxx::
  __normal_iterator<const_OpenMD::ZconsData_*,_std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>_>
  ::__normal_iterator(&local_48);
  local_48._M_current =
       (ZconsData *)
       std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>::begin
                 ((vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_> *)
                  in_stack_ffffffffffffff88);
  while( true ) {
    std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>::end
              ((vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_> *)
               in_stack_ffffffffffffff88);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff90,
                       (__normal_iterator<const_OpenMD::ZconsData_*,_std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    in_stack_ffffffffffffff90 =
         (__normal_iterator<const_OpenMD::ZconsData_*,_std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>_>
          *)((long)in_RDI + 0x40);
    __gnu_cxx::
    __normal_iterator<const_OpenMD::ZconsData_*,_std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>_>
    ::operator->(&local_48);
    std::
    map<int,_OpenMD::ZConsVisitor::ZConsState,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
    ::find(in_stack_ffffffffffffff88,(key_type *)0x353ef6);
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>::
             operator->((_Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>
                         *)0x353f05);
    ppVar2->second = zsFixed;
    __gnu_cxx::
    __normal_iterator<const_OpenMD::ZconsData_*,_std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>_>
    ::operator++(&local_48);
  }
  return;
}

Assistant:

void ZConsVisitor::update() {
    Vector3d com;
    std::map<int, ZConsState>::iterator i;
    for (i = zmolStates_.begin(); i != zmolStates_.end(); ++i) {
      i->second = zsMoving;
    }

    readZconsFile(currSnapshot_->getTime());

    const std::vector<ZconsData>& fixedZmolData =
        zconsReader_->getFixedZMolData();
    std::vector<ZconsData>::const_iterator j;
    for (j = fixedZmolData.begin(); j != fixedZmolData.end(); ++j) {
      std::map<int, ZConsState>::iterator k = zmolStates_.find(j->zmolIndex);
      assert(k != zmolStates_.end());
      k->second = zsFixed;
    }
  }